

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase286::run(TestCase286 *this)

{
  Promise<void> node;
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  Promise<void> promise;
  uint lines;
  String trace;
  int local_cc;
  DebugComparison<unsigned_int_&,_int> _kjCondition;
  WaitScope waitScope;
  EventLoop loop;
  
  EventLoop::EventLoop(&loop);
  EventLoop::enterScope(&loop);
  makeChain((anon_unknown_0 *)&promise,1000);
  EventLoop::run(&loop,0xffffffff);
  kj::_::PromiseBase::trace(&trace,&promise.super_PromiseBase);
  lines = 0;
  pcVar2 = trace.content.ptr;
  if (trace.content.size_ == 0) {
    pcVar2 = (char *)0x0;
  }
  pcVar3 = trace.content.ptr + (trace.content.size_ - 1);
  if (trace.content.size_ == 0) {
    pcVar3 = (char *)0x0;
  }
  if (pcVar2 == pcVar3) {
    _kjCondition.result = true;
  }
  else {
    lines = 0;
    do {
      lines = lines + (*pcVar2 == '\n');
      pcVar2 = pcVar2 + 1;
    } while (pcVar2 != pcVar3);
    _kjCondition.result = lines < 5;
  }
  _kjCondition.left = &lines;
  _kjCondition.right = 5;
  _kjCondition.op.content.ptr = " < ";
  _kjCondition.op.content.size_ = 4;
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    local_cc = 5;
    kj::_::Debug::
    log<char_const(&)[31],kj::_::DebugComparison<unsigned_int&,int>&,unsigned_int&,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x12e,ERROR,"\"failed: expected \" \"(lines) < (5)\", _kjCondition, lines, 5",
               (char (*) [31])"failed: expected (lines) < (5)",&_kjCondition,_kjCondition.left,
               &local_cc);
  }
  sVar1 = trace.content.size_;
  pcVar2 = trace.content.ptr;
  if (trace.content.ptr != (char *)0x0) {
    trace.content.ptr = (char *)0x0;
    trace.content.size_ = 0;
    (**(trace.content.disposer)->_vptr_ArrayDisposer)(trace.content.disposer,pcVar2,1,sVar1,sVar1,0)
    ;
  }
  node.super_PromiseBase.node.ptr = promise.super_PromiseBase.node.ptr;
  if (promise.super_PromiseBase.node.ptr != (OwnPromiseNode)0x0) {
    promise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.super_PromiseBase.node.ptr);
  }
  EventLoop::leaveScope(&loop);
  EventLoop::~EventLoop(&loop);
  return;
}

Assistant:

TEST(Async, DeepChain3) {
  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<void> promise = makeChain(1000);

  loop.run();

  auto trace = promise.trace();
  uint lines = 0;
  for (char c: trace) {
    lines += c == '\n';
  }

  // Chain nodes should have been collapsed such that instead of a chain of 1000 nodes, we have
  // 2-ish nodes.  We'll give a little room for implementation freedom.
  EXPECT_LT(lines, 5);
}